

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O3

int __thiscall booster::streambuf::overflow(streambuf *this,int c)

{
  pointer pcVar1;
  int iVar2;
  ulong in_RAX;
  io_device *piVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_28;
  
  lVar6 = (long)*(char **)&this->field_0x28 - *(long *)&this->field_0x20;
  if (lVar6 == 0) {
    uStack_28 = in_RAX & 0xffffffffffffff;
    std::vector<char,_std::allocator<char>_>::resize
              (&this->buffer_out_,this->buffer_size_ + 1,(value_type *)((long)&uStack_28 + 7));
    pcVar1 = (this->buffer_out_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)&this->field_0x28 = pcVar1;
    *(pointer *)&this->field_0x20 = pcVar1;
    *(pointer *)&this->field_0x30 = pcVar1 + this->buffer_size_;
    if (c != -1) {
      if ((long)this->buffer_size_ < 1) {
        (**(code **)(*(long *)this + 0x68))(this,c & 0xff);
      }
      else {
        *pcVar1 = (char)c;
        *(long *)&this->field_0x28 = *(long *)&this->field_0x28 + 1;
      }
    }
  }
  else {
    lVar5 = lVar6;
    if (c != -1) {
      **(char **)&this->field_0x28 = (char)c;
      lVar5 = lVar6 + 1;
    }
    if (lVar5 < 1) {
      lVar4 = *(long *)&this->field_0x28;
    }
    else {
      piVar3 = device(this);
      iVar2 = (*piVar3->_vptr_io_device[1])(piVar3,*(undefined8 *)&this->field_0x20,lVar5);
      lVar4 = *(long *)&this->field_0x28;
      if (CONCAT44(extraout_var,iVar2) != lVar5) {
        *(long *)&this->field_0x28 = lVar4 + iVar2;
        return -1;
      }
    }
    *(long *)&this->field_0x28 = -(int)lVar6 + lVar4;
  }
  return 0;
}

Assistant:

int streambuf::overflow(int c)
	{
		if(pptr()==pbase()) {
			buffer_out_.resize(buffer_size_+1,0);
			setp(&buffer_out_.front(),&buffer_out_.front()+buffer_size_);
			if(c!=EOF) {
				sputc(c);
			}
			return 0;
		}
		
		std::streamsize n=pptr() - pbase();
		std::streamsize real_size = n;

		if(c!=EOF) {
			*pptr()=c;
			real_size++;
		}
		if(real_size > 0) {
			size_t res = device().write(pbase(),real_size);
			if(std::streamsize(res) != real_size) {
				pbump(res);
				return EOF;
			}
		}
		pbump(-n);
		return 0;
	}